

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int32_t __thiscall icu_63::IslamicCalendar::trueMonthStart(IslamicCalendar *this,int32_t month)

{
  UBool UVar1;
  double dVar2;
  double age;
  UDate origin;
  UErrorCode local_18;
  int32_t start;
  UErrorCode status;
  int32_t month_local;
  IslamicCalendar *this_local;
  
  local_18 = U_ZERO_ERROR;
  start = month;
  _status = this;
  origin._4_4_ = CalendarCache::get(&gMonthCache,month,&local_18);
  if (origin._4_4_ == 0) {
    dVar2 = uprv_floor_63((double)start * 29.530588853);
    age = dVar2 * 86400000.0 + -42521587200000.0;
    dVar2 = moonAge(age,&local_18);
    UVar1 = ::U_FAILURE(local_18);
    if (UVar1 == '\0') {
      if (dVar2 < 0.0) {
        do {
          age = age + 86400000.0;
          dVar2 = moonAge(age,&local_18);
          UVar1 = ::U_FAILURE(local_18);
          if (UVar1 != '\0') goto LAB_00223dab;
        } while (dVar2 < 0.0);
      }
      else {
        do {
          age = age - 86400000.0;
          dVar2 = moonAge(age,&local_18);
          UVar1 = ::U_FAILURE(local_18);
          if (UVar1 != '\0') goto LAB_00223dab;
        } while (0.0 <= dVar2);
      }
      dVar2 = ClockMath::floorDivide(age - -42521587200000.0,86400000.0);
      origin._4_4_ = (int)dVar2 + 1;
      CalendarCache::put(&gMonthCache,start,origin._4_4_,&local_18);
    }
  }
LAB_00223dab:
  UVar1 = ::U_FAILURE(local_18);
  if (UVar1 != '\0') {
    origin._4_4_ = 0;
  }
  return origin._4_4_;
}

Assistant:

int32_t IslamicCalendar::trueMonthStart(int32_t month) const
{
    UErrorCode status = U_ZERO_ERROR;
    int32_t start = CalendarCache::get(&gMonthCache, month, status);

    if (start==0) {
        // Make a guess at when the month started, using the average length
        UDate origin = HIJRA_MILLIS 
            + uprv_floor(month * CalendarAstronomer::SYNODIC_MONTH) * kOneDay;

        // moonAge will fail due to memory allocation error
        double age = moonAge(origin, status);
        if (U_FAILURE(status)) {
            goto trueMonthStartEnd;
        }

        if (age >= 0) {
            // The month has already started
            do {
                origin -= kOneDay;
                age = moonAge(origin, status);
                if (U_FAILURE(status)) {
                    goto trueMonthStartEnd;
                }
            } while (age >= 0);
        }
        else {
            // Preceding month has not ended yet.
            do {
                origin += kOneDay;
                age = moonAge(origin, status);
                if (U_FAILURE(status)) {
                    goto trueMonthStartEnd;
                }
            } while (age < 0);
        }
        start = (int32_t)ClockMath::floorDivide((origin - HIJRA_MILLIS), (double)kOneDay) + 1;
        CalendarCache::put(&gMonthCache, month, start, status);
    }
trueMonthStartEnd :
    if(U_FAILURE(status)) {
        start = 0;
    }
    return start;
}